

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void resolveP2Values(Vdbe *p,int *pMaxFuncArgs)

{
  byte bVar1;
  int *piVar2;
  Op *pOVar3;
  int iVar4;
  uint uVar5;
  byte bVar6;
  uint uVar7;
  
  uVar5 = *pMaxFuncArgs;
  piVar2 = p->aLabel;
  *(ushort *)&p->field_0x9a = *(ushort *)&p->field_0x9a | 0x100;
  pOVar3 = p->aOp;
  iVar4 = p->nOp;
  do {
    if (iVar4 < 1) {
      sqlite3DbFree(p->db,p->aLabel);
      p->aLabel = (int *)0x0;
      *pMaxFuncArgs = uVar5;
      return;
    }
    bVar1 = pOVar3->opcode;
    bVar6 = ""[bVar1];
    pOVar3->opflags = bVar6;
    if (bVar1 == 0x12) {
LAB_0013dee0:
      if ((int)uVar5 <= (int)(uint)pOVar3->p5) {
        uVar5 = (uint)pOVar3->p5;
      }
    }
    else if (bVar1 == 0x23) {
      if (pOVar3->p2 != 0) {
LAB_0013df17:
        p->field_0x9b = p->field_0x9b & 0xfe;
        bVar6 = pOVar3->opflags;
      }
    }
    else {
      if (bVar1 == 0x51) {
LAB_0013deee:
        (pOVar3->p4).p = sqlite3BtreeNext;
      }
      else {
        if (bVar1 != 0x5c) {
          if (bVar1 != 0x5f) {
            if (bVar1 == 0x8c) {
              uVar7 = pOVar3->p2;
            }
            else {
              if (bVar1 == 0x7f) goto LAB_0013df17;
              if (bVar1 != 0x88) {
                if (bVar1 == 0x7b) goto LAB_0013dee0;
                goto LAB_0013df23;
              }
              uVar7 = pOVar3[-1].p1;
            }
            if ((int)uVar5 < (int)uVar7) {
              uVar5 = uVar7;
            }
            goto LAB_0013df23;
          }
          goto LAB_0013deee;
        }
        (pOVar3->p4).p = sqlite3BtreePrevious;
      }
      pOVar3->p4type = -0x13;
    }
LAB_0013df23:
    if (((bVar6 & 1) != 0) && (pOVar3->p2 < 0)) {
      pOVar3->p2 = piVar2[(uint)~pOVar3->p2];
    }
    pOVar3 = pOVar3 + 1;
    iVar4 = iVar4 + -1;
  } while( true );
}

Assistant:

static void resolveP2Values(Vdbe *p, int *pMaxFuncArgs){
  int i;
  int nMaxArgs = *pMaxFuncArgs;
  Op *pOp;
  int *aLabel = p->aLabel;
  p->readOnly = 1;
  for(pOp=p->aOp, i=p->nOp-1; i>=0; i--, pOp++){
    u8 opcode = pOp->opcode;

    pOp->opflags = sqlite3OpcodeProperty[opcode];
    if( opcode==OP_Function || opcode==OP_AggStep ){
      if( pOp->p5>nMaxArgs ) nMaxArgs = pOp->p5;
    }else if( (opcode==OP_Transaction && pOp->p2!=0) || opcode==OP_Vacuum ){
      p->readOnly = 0;
#ifndef SQLITE_OMIT_VIRTUALTABLE
    }else if( opcode==OP_VUpdate ){
      if( pOp->p2>nMaxArgs ) nMaxArgs = pOp->p2;
    }else if( opcode==OP_VFilter ){
      int n;
      assert( p->nOp - i >= 3 );
      assert( pOp[-1].opcode==OP_Integer );
      n = pOp[-1].p1;
      if( n>nMaxArgs ) nMaxArgs = n;
#endif
    }else if( opcode==OP_Next || opcode==OP_SorterNext ){
      pOp->p4.xAdvance = sqlite3BtreeNext;
      pOp->p4type = P4_ADVANCE;
    }else if( opcode==OP_Prev ){
      pOp->p4.xAdvance = sqlite3BtreePrevious;
      pOp->p4type = P4_ADVANCE;
    }

    if( (pOp->opflags & OPFLG_JUMP)!=0 && pOp->p2<0 ){
      assert( -1-pOp->p2<p->nLabel );
      pOp->p2 = aLabel[-1-pOp->p2];
    }
  }
  sqlite3DbFree(p->db, p->aLabel);
  p->aLabel = 0;

  *pMaxFuncArgs = nMaxArgs;
}